

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

int h2o_memis(void *_target,size_t target_len,void *_test,size_t test_len)

{
  int iVar1;
  char *test;
  char *target;
  size_t test_len_local;
  void *_test_local;
  size_t target_len_local;
  void *_target_local;
  
  if (target_len == test_len) {
    if (target_len == 0) {
      _target_local._4_4_ = 1;
    }
    else if (*_target == *_test) {
      iVar1 = memcmp((void *)((long)_target + 1),(void *)((long)_test + 1),test_len - 1);
      _target_local._4_4_ = (uint)(iVar1 == 0);
    }
    else {
      _target_local._4_4_ = 0;
    }
  }
  else {
    _target_local._4_4_ = 0;
  }
  return _target_local._4_4_;
}

Assistant:

inline int h2o_memis(const void *_target, size_t target_len, const void *_test, size_t test_len)
{
    const char *target = (const char *)_target, *test = (const char *)_test;
    if (target_len != test_len)
        return 0;
    if (target_len == 0)
        return 1;
    if (target[0] != test[0])
        return 0;
    return memcmp(target + 1, test + 1, test_len - 1) == 0;
}